

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertbmp.c
# Opt level: O0

OPJ_BOOL bmp_read_rle4_data(FILE *IN,OPJ_UINT8 *pData,OPJ_UINT32 stride,OPJ_UINT32 width,
                           OPJ_UINT32 height)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  byte local_74;
  byte local_6c;
  byte local_5d;
  int c1_int_1;
  OPJ_UINT8 c1_1;
  int j_1;
  uint uStack_50;
  OPJ_UINT8 c1;
  int c1_int;
  int j;
  int c;
  OPJ_UINT8 *beyond;
  OPJ_UINT8 *pix;
  OPJ_UINT32 written;
  OPJ_UINT32 y;
  OPJ_UINT32 x;
  OPJ_UINT32 height_local;
  OPJ_UINT32 width_local;
  OPJ_UINT32 stride_local;
  OPJ_UINT8 *pData_local;
  FILE *IN_local;
  
  pix._0_4_ = 0;
  pix._4_4_ = 0;
  written = 0;
  beyond = pData;
  while (pix._4_4_ < height) {
    iVar1 = getc((FILE *)IN);
    if (iVar1 == -1) {
      return 0;
    }
    if (iVar1 == 0) {
      uVar2 = getc((FILE *)IN);
      if (uVar2 == 0xffffffff) {
        return 0;
      }
      if (uVar2 == 0) {
        written = 0;
        pix._4_4_ = pix._4_4_ + 1;
        beyond = pData + pix._4_4_ * stride;
      }
      else {
        if (uVar2 == 1) break;
        if (uVar2 == 2) {
          iVar1 = getc((FILE *)IN);
          if (iVar1 == -1) {
            return 0;
          }
          written = iVar1 + written;
          iVar1 = getc((FILE *)IN);
          if (iVar1 == -1) {
            return 0;
          }
          pix._4_4_ = iVar1 + pix._4_4_;
          beyond = pData + (ulong)written + (ulong)(pix._4_4_ * stride);
        }
        else {
          local_5d = 0;
          c1_int_1 = 0;
          while( true ) {
            bVar3 = false;
            if ((c1_int_1 < (int)uVar2) && (bVar3 = false, written < width)) {
              bVar3 = beyond < pData + stride * height;
            }
            if (!bVar3) break;
            if ((c1_int_1 & 1U) == 0) {
              iVar1 = getc((FILE *)IN);
              if (iVar1 == -1) {
                return 0;
              }
              local_5d = (byte)iVar1;
            }
            if ((c1_int_1 & 1U) == 0) {
              local_74 = (byte)((int)(uint)local_5d >> 4);
            }
            else {
              local_74 = local_5d & 0xf;
            }
            *beyond = local_74;
            pix._0_4_ = (int)pix + 1;
            c1_int_1 = c1_int_1 + 1;
            written = written + 1;
            beyond = beyond + 1;
          }
          if ((((uVar2 & 3) == 1) || ((uVar2 & 3) == 2)) && (iVar1 = getc((FILE *)IN), iVar1 == -1))
          {
            return 0;
          }
        }
      }
    }
    else {
      uVar2 = getc((FILE *)IN);
      if (uVar2 == 0xffffffff) {
        return 0;
      }
      uStack_50 = 0;
      while( true ) {
        bVar3 = false;
        if (((int)uStack_50 < iVar1) && (bVar3 = false, written < width)) {
          bVar3 = beyond < pData + stride * height;
        }
        if (!bVar3) break;
        if ((uStack_50 & 1) == 0) {
          local_6c = (byte)((int)(uVar2 & 0xff) >> 4);
        }
        else {
          local_6c = (byte)uVar2 & 0xf;
        }
        *beyond = local_6c;
        pix._0_4_ = (int)pix + 1;
        uStack_50 = uStack_50 + 1;
        written = written + 1;
        beyond = beyond + 1;
      }
    }
  }
  if ((int)pix != width * height) {
    fprintf(_stderr,"warning, image\'s actual size does not match advertized one\n");
    return 0;
  }
  return 1;
}

Assistant:

static OPJ_BOOL bmp_read_rle4_data(FILE* IN, OPJ_UINT8* pData,
                                   OPJ_UINT32 stride, OPJ_UINT32 width, OPJ_UINT32 height)
{
    OPJ_UINT32 x, y, written;
    OPJ_UINT8 *pix;
    const OPJ_UINT8 *beyond;

    beyond = pData + stride * height;
    pix = pData;
    x = y = written = 0U;
    while (y < height) {
        int c = getc(IN);
        if (c == EOF) {
            return OPJ_FALSE;
        }

        if (c) { /* encoded mode */
            int j, c1_int;
            OPJ_UINT8 c1;

            c1_int = getc(IN);
            if (c1_int == EOF) {
                return OPJ_FALSE;
            }
            c1 = (OPJ_UINT8)c1_int;

            for (j = 0; (j < c) && (x < width) &&
                    ((OPJ_SIZE_T)pix < (OPJ_SIZE_T)beyond); j++, x++, pix++) {
                *pix = (OPJ_UINT8)((j & 1) ? (c1 & 0x0fU) : ((c1 >> 4) & 0x0fU));
                written++;
            }
        } else { /* absolute mode */
            c = getc(IN);
            if (c == EOF) {
                return OPJ_FALSE;
            }

            if (c == 0x00) { /* EOL */
                x = 0;
                y++;
                pix = pData + y * stride;
            } else if (c == 0x01) { /* EOP */
                break;
            } else if (c == 0x02) { /* MOVE by dxdy */
                c = getc(IN);
                if (c == EOF) {
                    return OPJ_FALSE;
                }
                x += (OPJ_UINT32)c;
                c = getc(IN);
                if (c == EOF) {
                    return OPJ_FALSE;
                }
                y += (OPJ_UINT32)c;
                pix = pData + y * stride + x;
            } else { /* 03 .. 255 : absolute mode */
                int j;
                OPJ_UINT8 c1 = 0U;

                for (j = 0; (j < c) && (x < width) &&
                        ((OPJ_SIZE_T)pix < (OPJ_SIZE_T)beyond); j++, x++, pix++) {
                    if ((j & 1) == 0) {
                        int c1_int;
                        c1_int = getc(IN);
                        if (c1_int == EOF) {
                            return OPJ_FALSE;
                        }
                        c1 = (OPJ_UINT8)c1_int;
                    }
                    *pix = (OPJ_UINT8)((j & 1) ? (c1 & 0x0fU) : ((c1 >> 4) & 0x0fU));
                    written++;
                }
                if (((c & 3) == 1) || ((c & 3) == 2)) { /* skip padding byte */
                    c = getc(IN);
                    if (c == EOF) {
                        return OPJ_FALSE;
                    }
                }
            }
        }
    }  /* while(y < height) */
    if (written != width * height) {
        fprintf(stderr, "warning, image's actual size does not match advertized one\n");
        return OPJ_FALSE;
    }
    return OPJ_TRUE;
}